

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::executeAccessingBoundingBoxType
               (NegativeTestContext *ctx,string *builtInTypeName,GLSLVersion glslVersion)

{
  string shaderSource;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  bool bVar1;
  long *plVar2;
  ostream *poVar3;
  size_type *psVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  string extensionPrim;
  string version;
  string extensionTess;
  ostringstream sourceStream;
  _Alloc_hider _Var8;
  size_type sVar9;
  undefined1 uVar10;
  undefined7 uVar11;
  undefined8 in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  char *local_308;
  char *local_300;
  char local_2f8;
  undefined7 uStack_2f7;
  char *local_2e8;
  long local_2e0;
  char local_2d8;
  undefined7 uStack_2d7;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  char *local_288;
  char *local_280;
  char local_278;
  undefined7 uStack_277;
  long *local_268;
  ExpectResult local_260;
  long local_258 [2];
  long *local_248;
  ExpectResult local_240;
  long local_238 [2];
  long *local_228;
  ExpectResult local_220;
  long local_218 [2];
  long *local_208;
  ExpectResult local_200;
  long local_1f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_2e8 = &local_2d8;
  local_2e0 = 0;
  local_2d8 = '\0';
  local_308 = &local_2f8;
  local_300 = (char *)0x0;
  local_2f8 = '\0';
  local_288 = &local_278;
  local_280 = (char *)0x0;
  local_278 = '\0';
  if (glslVersion == GLSL_VERSION_310_ES) {
    std::__cxx11::string::_M_replace((ulong)&local_2e8,0,(char *)0x0,0x1af0f1a);
    std::__cxx11::string::_M_replace((ulong)&local_308,0,local_300,0x1c7d9ea);
    pcVar7 = "#extension GL_EXT_tessellation_shader : require\n";
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_2e8,0,(char *)0x0,0x1c589cc);
    pcVar7 = "";
    std::__cxx11::string::_M_replace((ulong)&local_308,0,local_300,0x1aee929);
  }
  std::__cxx11::string::_M_replace((ulong)&local_288,0,local_280,(ulong)pcVar7);
  std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_368);
  paVar6 = &local_348.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_348.field_2._M_allocated_capacity = *psVar4;
    local_348.field_2._8_8_ = plVar2[3];
    local_348._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
    local_348.field_2._M_allocated_capacity = *psVar4;
    local_348._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_348._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    in_stack_fffffffffffffc90 = plVar2[3];
    uVar10 = (undefined1)*plVar5;
    uVar11 = (undefined7)((ulong)*plVar5 >> 8);
    _Var8._M_p = &stack0xfffffffffffffc88;
  }
  else {
    uVar10 = (undefined1)*plVar5;
    uVar11 = (undefined7)((ulong)*plVar5 >> 8);
    _Var8._M_p = (pointer)*plVar2;
  }
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffc78);
  if (_Var8._M_p != &stack0xfffffffffffffc88) {
    operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar6) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2e8,local_2e0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_308,(long)local_300);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  std::operator+(&local_348,"\t",builtInTypeName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    in_stack_fffffffffffffc90 = plVar2[3];
    uVar10 = (undefined1)*plVar5;
    uVar11 = (undefined7)((ulong)*plVar5 >> 8);
    _Var8._M_p = &stack0xfffffffffffffc88;
  }
  else {
    uVar10 = (undefined1)*plVar5;
    uVar11 = (undefined7)((ulong)*plVar5 >> 8);
    _Var8._M_p = (pointer)*plVar2;
  }
  sVar9 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,_Var8._M_p,sVar9);
  std::operator+(&local_328,"\tgl_Position = ",builtInTypeName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_328);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_368.field_2._M_allocated_capacity = *psVar4;
    local_368.field_2._8_8_ = plVar2[3];
  }
  else {
    local_368.field_2._M_allocated_capacity = *psVar4;
    local_368._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_368._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_368._M_dataplus._M_p,local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if (_Var8._M_p != &stack0xfffffffffffffc88) {
    operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar6) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  shaderSource._M_string_length = sVar9;
  shaderSource._M_dataplus._M_p = _Var8._M_p;
  shaderSource.field_2._M_local_buf[0] = uVar10;
  shaderSource.field_2._M_allocated_capacity._1_7_ = uVar11;
  shaderSource.field_2._8_8_ = in_stack_fffffffffffffc90;
  verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)0x0,(ShaderType)local_208,shaderSource,
               local_200);
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  NegativeTestContext::endSection(ctx);
  uVar10 = '\0';
  _Var8._M_p = &stack0xfffffffffffffc88;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if (_Var8._M_p != &stack0xfffffffffffffc88) {
    operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
  }
  bVar1 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_EVALUATION);
  if (bVar1) {
    std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_368);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_348.field_2._M_allocated_capacity = *psVar4;
      local_348.field_2._8_8_ = plVar2[3];
      local_348._M_dataplus._M_p = (pointer)paVar6;
    }
    else {
      local_348.field_2._M_allocated_capacity = *psVar4;
      local_348._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_348._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      in_stack_fffffffffffffc90 = plVar2[3];
      uVar10 = (undefined1)*plVar5;
      uVar11 = (undefined7)((ulong)*plVar5 >> 8);
      _Var8._M_p = &stack0xfffffffffffffc88;
    }
    else {
      uVar10 = (undefined1)*plVar5;
      uVar11 = (undefined7)((ulong)*plVar5 >> 8);
      _Var8._M_p = (pointer)*plVar2;
    }
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffc78);
    if (_Var8._M_p != &stack0xfffffffffffffc88) {
      operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar6) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2e8,local_2e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_308,(long)local_300);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_288,(long)local_280);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"layout (triangles, equal_spacing, ccw) in;\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
    std::operator+(&local_348,"\t",builtInTypeName);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      in_stack_fffffffffffffc90 = plVar2[3];
      uVar10 = (undefined1)*plVar5;
      uVar11 = (undefined7)((ulong)*plVar5 >> 8);
      _Var8._M_p = &stack0xfffffffffffffc88;
    }
    else {
      uVar10 = (undefined1)*plVar5;
      uVar11 = (undefined7)((ulong)*plVar5 >> 8);
      _Var8._M_p = (pointer)*plVar2;
    }
    sVar9 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,_Var8._M_p,sVar9);
    std::operator+(&local_328,"\tgl_Position = (\tgl_TessCoord.x * ",builtInTypeName);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_328);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_368.field_2._M_allocated_capacity = *psVar4;
      local_368.field_2._8_8_ = plVar2[3];
    }
    else {
      local_368.field_2._M_allocated_capacity = *psVar4;
      local_368._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_368._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_368._M_dataplus._M_p,local_368._M_string_length);
    std::operator+(&local_1c8,"\t\t\t\t\tgl_TessCoord.y * ",builtInTypeName);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_298 = *plVar5;
      lStack_290 = plVar2[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar5;
      local_2a8 = (long *)*plVar2;
    }
    local_2a0 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_2a8,local_2a0);
    std::operator+(&local_1e8,"\t\t\t\t\tgl_TessCoord.z * ",builtInTypeName);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_2b8 = *plVar5;
      lStack_2b0 = plVar2[3];
      local_2c8 = &local_2b8;
    }
    else {
      local_2b8 = *plVar5;
      local_2c8 = (long *)*plVar2;
    }
    local_2c0 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_2c8,local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if (_Var8._M_p != &stack0xfffffffffffffc88) {
      operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    shaderSource_00._M_string_length = sVar9;
    shaderSource_00._M_dataplus._M_p = _Var8._M_p;
    shaderSource_00.field_2._M_local_buf[0] = uVar10;
    shaderSource_00.field_2._M_allocated_capacity._1_7_ = uVar11;
    shaderSource_00.field_2._8_8_ = in_stack_fffffffffffffc90;
    verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)&DAT_00000004,(ShaderType)local_228,
                 shaderSource_00,local_220);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    NegativeTestContext::endSection(ctx);
    uVar10 = '\0';
    _Var8._M_p = &stack0xfffffffffffffc88;
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if (_Var8._M_p != &stack0xfffffffffffffc88) {
      operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
    }
  }
  paVar6 = &local_348.field_2;
  bVar1 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_GEOMETRY);
  if (bVar1) {
    std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_368);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_348.field_2._M_allocated_capacity = *psVar4;
      local_348.field_2._8_8_ = plVar2[3];
      local_348._M_dataplus._M_p = (pointer)paVar6;
    }
    else {
      local_348.field_2._M_allocated_capacity = *psVar4;
      local_348._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_348._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      in_stack_fffffffffffffc90 = plVar2[3];
      uVar10 = (undefined1)*plVar5;
      uVar11 = (undefined7)((ulong)*plVar5 >> 8);
      _Var8._M_p = &stack0xfffffffffffffc88;
    }
    else {
      uVar10 = (undefined1)*plVar5;
      uVar11 = (undefined7)((ulong)*plVar5 >> 8);
      _Var8._M_p = (pointer)*plVar2;
    }
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffc78);
    if (_Var8._M_p != &stack0xfffffffffffffc88) {
      operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar6) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2e8,local_2e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_308,(long)local_300);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"layout (triangles) in;\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"layout (triangle_strip, max_vertices = 3) out;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
    std::operator+(&local_348,"\t",builtInTypeName);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      in_stack_fffffffffffffc90 = plVar2[3];
      uVar10 = (undefined1)*plVar5;
      uVar11 = (undefined7)((ulong)*plVar5 >> 8);
      _Var8._M_p = &stack0xfffffffffffffc88;
    }
    else {
      uVar10 = (undefined1)*plVar5;
      uVar11 = (undefined7)((ulong)*plVar5 >> 8);
      _Var8._M_p = (pointer)*plVar2;
    }
    sVar9 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,_Var8._M_p,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\tfor (int idx = 0; idx < 3; idx++)\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t{\n",3);
    std::operator+(&local_328,"\t\tgl_Position = gl_in[idx].gl_Position * ",builtInTypeName);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_328);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_368.field_2._M_allocated_capacity = *psVar4;
      local_368.field_2._8_8_ = plVar2[3];
    }
    else {
      local_368.field_2._M_allocated_capacity = *psVar4;
      local_368._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_368._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_368._M_dataplus._M_p,local_368._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t\tEmitVertex();\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t}\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tEndPrimitive();\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if (_Var8._M_p != &stack0xfffffffffffffc88) {
      operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar6) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    shaderSource_01._M_string_length = sVar9;
    shaderSource_01._M_dataplus._M_p = _Var8._M_p;
    shaderSource_01.field_2._M_local_buf[0] = uVar10;
    shaderSource_01.field_2._M_allocated_capacity._1_7_ = uVar11;
    shaderSource_01.field_2._8_8_ = in_stack_fffffffffffffc90;
    verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)0x2,(ShaderType)local_248,
                 shaderSource_01,local_240);
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
    NegativeTestContext::endSection(ctx);
    uVar10 = '\0';
    _Var8._M_p = &stack0xfffffffffffffc88;
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if (_Var8._M_p != &stack0xfffffffffffffc88) {
      operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
    }
  }
  std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_368);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_348.field_2._M_allocated_capacity = *psVar4;
    local_348.field_2._8_8_ = plVar2[3];
    local_348._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
    local_348.field_2._M_allocated_capacity = *psVar4;
    local_348._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_348._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    in_stack_fffffffffffffc90 = plVar2[3];
    uVar10 = (undefined1)*plVar5;
    uVar11 = (undefined7)((ulong)*plVar5 >> 8);
    _Var8._M_p = &stack0xfffffffffffffc88;
  }
  else {
    uVar10 = (undefined1)*plVar5;
    uVar11 = (undefined7)((ulong)*plVar5 >> 8);
    _Var8._M_p = (pointer)*plVar2;
  }
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffc78);
  if (_Var8._M_p != &stack0xfffffffffffffc88) {
    operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar6) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2e8,local_2e0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_308,(long)local_300);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"layout (location = 0) out mediump vec4 fs_colour;\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  std::operator+(&local_348,"\t",builtInTypeName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    in_stack_fffffffffffffc90 = plVar2[3];
    uVar10 = (undefined1)*plVar5;
    uVar11 = (undefined7)((ulong)*plVar5 >> 8);
    _Var8._M_p = &stack0xfffffffffffffc88;
  }
  else {
    uVar10 = (undefined1)*plVar5;
    uVar11 = (undefined7)((ulong)*plVar5 >> 8);
    _Var8._M_p = (pointer)*plVar2;
  }
  sVar9 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,_Var8._M_p,sVar9);
  std::operator+(&local_328,"\tfs_colour = ",builtInTypeName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_328);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_368.field_2._M_allocated_capacity = *psVar4;
    local_368.field_2._8_8_ = plVar2[3];
  }
  else {
    local_368.field_2._M_allocated_capacity = *psVar4;
    local_368._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_368._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_368._M_dataplus._M_p,local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if (_Var8._M_p != &stack0xfffffffffffffc88) {
    operator_delete(_Var8._M_p,CONCAT71(uVar11,uVar10) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar6) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  shaderSource_02._M_string_length = sVar9;
  shaderSource_02._M_dataplus._M_p = _Var8._M_p;
  shaderSource_02.field_2._M_local_buf[0] = uVar10;
  shaderSource_02.field_2._M_allocated_capacity._1_7_ = uVar11;
  shaderSource_02.field_2._8_8_ = in_stack_fffffffffffffc90;
  verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)&DAT_00000001,(ShaderType)local_268,
               shaderSource_02,local_260);
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  NegativeTestContext::endSection(ctx);
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void executeAccessingBoundingBoxType (NegativeTestContext& ctx, const std::string builtInTypeName, glu::GLSLVersion glslVersion)
{
	std::ostringstream	sourceStream;
	std::string			version;
	std::string			extensionPrim;
	std::string			extensionTess;

	if (glslVersion == glu::GLSL_VERSION_310_ES)
	{
		version = "#version 310 es\n";
		extensionPrim = "#extension GL_EXT_primitive_bounding_box : require\n";
		extensionTess = "#extension GL_EXT_tessellation_shader : require\n";
	}
	else if (glslVersion >= glu::GLSL_VERSION_320_ES)
	{
		version = "#version 320 es\n";
		extensionPrim = "";
		extensionTess = "";
	}
	else
	{
		DE_FATAL("error: context below 3.1 and not supported");
	}

	ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in vertex shader");
	sourceStream	<< version
					<< extensionPrim
					<< "void main()\n"
					<< "{\n"
					<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	gl_Position = " + builtInTypeName + "[0];\n"
					<< "}\n";
	verifyShader(ctx, glu::SHADERTYPE_VERTEX, sourceStream.str(), EXPECT_RESULT_FAIL);
	ctx.endSection();

	sourceStream.str(std::string());

	if (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_EVALUATION))
	{
		ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in tessellation evaluation shader");
		sourceStream	<< version
						<< extensionPrim
						<< extensionTess
						<< "layout (triangles, equal_spacing, ccw) in;\n"
						<< "void main()\n"
						<< "{\n"
						<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	gl_Position = (	gl_TessCoord.x * " +  builtInTypeName + "[0] +\n"
						<< "					gl_TessCoord.y * " +  builtInTypeName + "[0] +\n"
						<< "					gl_TessCoord.z * " +  builtInTypeName + "[0]);\n"
						<< "}\n";
		verifyShader(ctx, glu::SHADERTYPE_TESSELLATION_EVALUATION, sourceStream.str(), EXPECT_RESULT_FAIL);
		ctx.endSection();

		sourceStream.str(std::string());
	}

	if (ctx.isShaderSupported(glu::SHADERTYPE_GEOMETRY))
	{
		ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in geometry shader");
		sourceStream	<< version
						<< extensionPrim
						<< "layout (triangles) in;\n"
						<< "layout (triangle_strip, max_vertices = 3) out;\n"
						<< "void main()\n"
						<< "{\n"
						<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	for (int idx = 0; idx < 3; idx++)\n"
						<< "	{\n"
						<< "		gl_Position = gl_in[idx].gl_Position * " + builtInTypeName + "[0];\n"
						<< "		EmitVertex();\n"
						<< "	}\n"
						<< "	EndPrimitive();\n"
						<< "}\n";
		verifyShader(ctx, glu::SHADERTYPE_GEOMETRY, sourceStream.str(), EXPECT_RESULT_FAIL);
		ctx.endSection();

		sourceStream.str(std::string());
	}

	ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in fragment shader");
	sourceStream	<< version
					<< extensionPrim
					<< "layout (location = 0) out mediump vec4 fs_colour;\n"
					<< "void main()\n"
					<< "{\n"
					<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	fs_colour = " + builtInTypeName + "[0];\n"
					<< "}\n";
	verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, sourceStream.str(), EXPECT_RESULT_FAIL);
	ctx.endSection();
}